

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFontAtlas::ClearFonts(ImFontAtlas *this)

{
  ImFont *this_00;
  ImFont **ptr;
  long lVar1;
  
  if (this->Locked == false) {
    if (0 < (this->Fonts).Size) {
      lVar1 = 0;
      do {
        this_00 = (this->Fonts).Data[lVar1];
        if (this_00 != (ImFont *)0x0) {
          ImFont::~ImFont(this_00);
          ImGui::MemFree(this_00);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < (this->Fonts).Size);
    }
    ptr = (this->Fonts).Data;
    if (ptr != (ImFont **)0x0) {
      (this->Fonts).Size = 0;
      (this->Fonts).Capacity = 0;
      ImGui::MemFree(ptr);
      (this->Fonts).Data = (ImFont **)0x0;
    }
    return;
  }
  __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/imgui/imgui_draw.cpp"
                ,0x66a,"void ImFontAtlas::ClearFonts()");
}

Assistant:

void    ImFontAtlas::ClearFonts()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    for (int i = 0; i < Fonts.Size; i++)
        IM_DELETE(Fonts[i]);
    Fonts.clear();
}